

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BigIndex * __thiscall Js::JavascriptArray::BigIndex::operator--(BigIndex *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if (this->index == 0xffffffff) {
    if (this->bigIndex < 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2b6e,"(index == InvalidIndex && bigIndex >= InvalidIndex)",
                                  "index == InvalidIndex && bigIndex >= InvalidIndex");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    uVar4 = this->bigIndex - 1;
    this->bigIndex = uVar4;
    if (uVar4 < 0xffffffff) {
      this->index = 0xfffffffe;
      this->bigIndex = 0xffffffff;
    }
  }
  else {
    this->index = this->index - 1;
  }
  return this;
}

Assistant:

const JavascriptArray::BigIndex& JavascriptArray::BigIndex::operator--()
    {
        if (IsSmallIndex())
        {
            --index;
        }
        else
        {
            Assert(index == InvalidIndex && bigIndex >= InvalidIndex);

            --bigIndex;
            if (bigIndex < InvalidIndex)
            {
                index = InvalidIndex - 1;
                bigIndex = InvalidIndex;
            }
        }

        return *this;
    }